

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsinput.h
# Opt level: O2

void __thiscall soplex::MPSInput::syntaxError(MPSInput *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Syntax error in line ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_lineno);
  std::endl<char,std::char_traits<char>>(poVar1);
  this->m_section = ENDATA;
  this->m_has_error = true;
  return;
}

Assistant:

void syntaxError()
   {
      SPX_MSG_ERROR(std::cerr << "Syntax error in line " << m_lineno << std::endl;)
      m_section = ENDATA;
      m_has_error = true;
   }